

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

time_t clask::
       to_time_t<std::chrono::time_point<std::filesystem::__file_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                 (time_point<std::filesystem::__file_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  tp)

{
  time_point tVar1;
  long lVar2;
  
  tVar1 = std::filesystem::__file_clock::now();
  lVar2 = std::chrono::_V2::system_clock::now();
  return (lVar2 + ((long)tp.__d.__r - (long)tVar1.__d.__r)) / 1000000000;
}

Assistant:

std::time_t to_time_t(TP tp) {
  using namespace std::chrono;
  auto sctp = time_point_cast<system_clock::duration>(tp - TP::clock::now() + system_clock::now());
  return system_clock::to_time_t(sctp);
}